

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  TimingControlSyntax *pTVar3;
  ContinuousAssignSyntax *pCVar4;
  _Storage<const_slang::ast::TimingControl_*,_true> _Var5;
  Expression *pEVar6;
  TimingControl *pTVar7;
  LookupLocation LVar8;
  ExpressionVarVisitor visitor;
  ASTContext context;
  ExpressionVarVisitor local_51;
  ASTContext local_50;
  undefined4 extraout_var;
  
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
LAB_001c4938:
    pTVar7 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
             _M_value;
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    pSVar2 = (this->super_Symbol).originatingSyntax;
    if ((pSVar2 == (SyntaxNode *)0x0 || pSVar1 == (Scope *)0x0) ||
       (pSVar2 = pSVar2->parent, pSVar2 == (SyntaxNode *)0x0)) {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
LAB_001c4a4d:
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
    }
    else {
      pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(pSVar2);
      pTVar3 = pCVar4->delay;
      if (pTVar3 != (TimingControlSyntax *)0x0) {
        LVar8 = LookupLocation::before(&this->super_Symbol);
        local_50.lookupIndex = LVar8.index;
        local_50.flags.m_bits = 0x80;
        local_50.instanceOrProc = (Symbol *)0x0;
        local_50.firstTempVar = (TempVarSymbol *)0x0;
        local_50.randomizeDetails = (RandomizeDetails *)0x0;
        local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
        local_50.scope.ptr = pSVar1;
        if (LVar8.scope != pSVar1 && LVar8.scope != (Scope *)0x0) {
          assert::assertFailed
                    ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                     ,0x119,
                     "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                    );
        }
        _Var5._0_4_ = TimingControl::bind((int)pTVar3,(sockaddr *)&local_50,local_50.lookupIndex);
        _Var5._4_4_ = extraout_var;
        (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload = _Var5;
        if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
            false) {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
               true;
        }
        if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
            false) {
          std::__throw_bad_optional_access();
        }
        pTVar7 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
                 _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                 _M_payload._M_value;
        if (((pTVar7->kind == Delay3) && (pTVar7[1].syntax != (SyntaxNode *)0x0)) &&
           (pEVar6 = getAssignment(this), pEVar6->kind == Assignment)) {
          pEVar6 = (Expression *)pEVar6[1].constant;
          local_51.anyVars = false;
          Expression::
          visitExpression<slang::ast::Expression_const,slang::ast::ExpressionVarVisitor&>
                    (pEVar6,pEVar6,&local_51);
          if (local_51.anyVars == true) {
            ASTContext::addDiag(&local_50,(DiagCode)0x190006,pEVar6->sourceRange);
          }
        }
        goto LAB_001c4938;
      }
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
      if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
          false) goto LAB_001c4a4d;
    }
    pTVar7 = (TimingControl *)0x0;
  }
  return pTVar7;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}